

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O0

int Pla_CubeHashValue(Vec_Int_t *vCube)

{
  int iVar1;
  undefined4 local_1c;
  int Value;
  int Lit;
  int i;
  Vec_Int_t *vCube_local;
  
  local_1c = 0;
  for (Value = 0; iVar1 = Vec_IntSize(vCube), Value < iVar1; Value = Value + 1) {
    iVar1 = Vec_IntEntry(vCube,Value);
    iVar1 = Pla_HashValue(iVar1);
    local_1c = iVar1 + local_1c;
  }
  return local_1c;
}

Assistant:

static inline int Pla_CubeHashValue( Vec_Int_t * vCube )
{
    int i, Lit, Value = 0;
    Vec_IntForEachEntry( vCube, Lit, i )
        Value += Pla_HashValue(Lit);
    return Value;
}